

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  istream *this;
  ostream *poVar1;
  int i_1;
  long lVar2;
  int i;
  long lVar3;
  int m;
  int n;
  int b;
  int a;
  vector<int> v;
  vector<std::pair<int,_int>_> data;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  vector<int> local_70;
  vector<std::pair<int,_int>_> local_58;
  vector<std::pair<int,_int>_> local_40;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105150) = 0;
  CP::vector<int>::vector(&local_70);
  CP::vector<std::pair<int,_int>_>::vector(&local_58);
  std::istream::operator>>((istream *)&std::cin,&local_7c);
  CP::vector<int>::resize(&local_70,(long)local_7c);
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < local_7c; lVar3 = lVar3 + 1) {
    std::istream::operator>>((istream *)&std::cin,(int *)((long)local_70.mData + lVar2));
    lVar2 = lVar2 + 4;
  }
  std::istream::operator>>((istream *)&std::cin,&local_80);
  CP::vector<std::pair<int,_int>_>::resize(&local_58,(long)local_80);
  for (lVar2 = 0; lVar2 < local_80; lVar2 = lVar2 + 1) {
    this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_74);
    std::istream::operator>>(this,&local_78);
    local_58.mData[lVar2].first = local_74;
    local_58.mData[lVar2].second = local_78;
  }
  CP::vector<std::pair<int,_int>_>::vector(&local_40,&local_58);
  CP::vector<int>::insert_many(&local_70,&local_40);
  CP::vector<std::pair<int,_int>_>::~vector(&local_40);
  for (lVar2 = 0; local_70.mSize << 2 != lVar2; lVar2 = lVar2 + 4) {
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)local_70.mData + lVar2));
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  CP::vector<std::pair<int,_int>_>::~vector(&local_58);
  CP::vector<int>::~vector(&local_70);
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(NULL);

  int n,m;
  CP::vector<int> v;
  CP::vector<std::pair<int,int>> data;
  std::cin >> n;
  v.resize(n);
  for (int i = 0;i < n;i++)  {
    std::cin >> v[i];
  }
  std::cin >> m;
  data.resize(m);
  for (int i = 0;i < m;i++) {
    int a,b;
    std::cin >> a >> b;
    data[i] = {a,b};
  }


  v.insert_many(data);
  for (auto &x : v) {
    std::cout << x << " ";
  }
  std::cout << std::endl;

}